

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

void register_logging(char *filename,uint32_t *cats,int *level)

{
  Node *pNVar1;
  list<file_data> *plVar2;
  int iVar3;
  Node *pNVar4;
  Node *pNVar5;
  
  if (first_register == '\0') {
    logging_init();
  }
  plVar2 = file_data_list;
  pNVar5 = file_data_list->mHead;
  pNVar1 = file_data_list->mTail;
  do {
    pNVar5 = pNVar5->next;
    if (pNVar5 == pNVar1) {
      pNVar4 = (Node *)operator_new(0x28,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                    ,0xa7);
      (pNVar4->val).filename = filename;
      (pNVar4->val).cats = cats;
      (pNVar4->val).level = level;
      pNVar5 = plVar2->mTail;
      pNVar1 = pNVar5->prev;
      pNVar4->prev = pNVar1;
      pNVar4->next = pNVar5;
      pNVar1->next = pNVar4;
      pNVar5->prev = pNVar4;
      goto LAB_00122e3d;
    }
    iVar3 = strcasecmp((pNVar5->val).filename,filename);
  } while (iVar3 < 1);
  pNVar5 = pNVar5->prev;
  pNVar4 = (Node *)operator_new(0x28);
  (pNVar4->val).filename = filename;
  (pNVar4->val).cats = cats;
  (pNVar4->val).level = level;
  pNVar4->prev = pNVar5;
  pNVar1 = pNVar5->next;
  pNVar4->next = pNVar1;
  pNVar1->prev = pNVar4;
  pNVar5->next = pNVar4;
LAB_00122e3d:
  if (jh_log_names_buffer != (char *)0x0) {
    free(jh_log_names_buffer);
    jh_log_names_buffer = (char *)0x0;
  }
  return;
}

Assistant:

void register_logging( const char *filename, uint32_t *cats, int *level )
{
	struct file_data node;

	TRACE_BEGIN(LOG_LVL_INFO);

	if ( first_register )
		logging_init();

	node.filename = filename;
	node.cats = cats;
	node.level = level;

	bool found = false;
	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		if ( strcasecmp( i->filename, filename) > 0 )
		{
			i.insertBefore(node);
			found = true;
			break;
		}
	}
	
	if ( not found )
	{
		file_data_list->push_back(node);
	}

	// if we have already built the name buffer then delete it since we just 
	//  changed it.
	if ( jh_log_names_buffer != NULL )
	{
		LOGGING_FREE( jh_log_names_buffer );
		jh_log_names_buffer = NULL;
	}
	
	TRACE_END();
}